

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

void __thiscall
diligent_spirv_cross::StringStream<4096UL,_4096UL>::reset(StringStream<4096UL,_4096UL> *this)

{
  size_t sVar1;
  Buffer *pBVar2;
  undefined1 *__ptr;
  char *__ptr_00;
  long lVar3;
  
  sVar1 = (this->saved_buffers).
          super_VectorView<diligent_spirv_cross::StringStream<4096UL,_4096UL>::Buffer>.buffer_size;
  if (sVar1 != 0) {
    pBVar2 = (this->saved_buffers).
             super_VectorView<diligent_spirv_cross::StringStream<4096UL,_4096UL>::Buffer>.ptr;
    lVar3 = 0;
    do {
      __ptr = *(undefined1 **)((long)&pBVar2->buffer + lVar3);
      if (__ptr != this->stack_buffer) {
        free(__ptr);
      }
      lVar3 = lVar3 + 0x18;
    } while (sVar1 * 0x18 != lVar3);
  }
  __ptr_00 = (this->current_buffer).buffer;
  if (__ptr_00 != this->stack_buffer) {
    free(__ptr_00);
  }
  (this->saved_buffers).super_VectorView<diligent_spirv_cross::StringStream<4096UL,_4096UL>::Buffer>
  .buffer_size = 0;
  (this->current_buffer).buffer = this->stack_buffer;
  (this->current_buffer).offset = 0;
  (this->current_buffer).size = 0x1000;
  return;
}

Assistant:

void reset()
	{
		for (auto &saved : saved_buffers)
			if (saved.buffer != stack_buffer)
				free(saved.buffer);
		if (current_buffer.buffer != stack_buffer)
			free(current_buffer.buffer);

		saved_buffers.clear();
		current_buffer.buffer = stack_buffer;
		current_buffer.offset = 0;
		current_buffer.size = sizeof(stack_buffer);
	}